

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

void __thiscall
QDialogButtonBoxPrivate::addButton
          (QDialogButtonBoxPrivate *this,QAbstractButton *button,ButtonRole role,
          LayoutRule layoutRule,AddRule addRule)

{
  long in_FS_OFFSET;
  Object local_48 [8];
  code *local_40;
  undefined8 uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QAbstractButton_*>::append(this->buttonLists + role,button);
  if (addRule == Connect) {
    local_40 = handleButtonClicked;
    uStack_38 = 0;
    QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QDialogButtonBoxPrivate::*)()>
              ((Object *)&stack0xffffffffffffffd0,(offset_in_QAbstractButton_to_subr)button,
               (Object *)QAbstractButton::clicked,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd0);
    local_40 = handleButtonDestroyed;
    uStack_38 = 0;
    QObjectPrivate::connect<void(QObject::*)(QObject*),void(QDialogButtonBoxPrivate::*)()>
              (local_48,(offset_in_QObject_to_subr)button,(Object *)QObject::destroyed,0,
               (ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_48);
    QObject::installEventFilter((QObject *)button);
  }
  if (layoutRule == DoLayout) {
    layoutButtons(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::addButton(QAbstractButton *button, QDialogButtonBox::ButtonRole role,
                                        LayoutRule layoutRule, AddRule addRule)
{
    buttonLists[role].append(button);
    switch (addRule) {
    case AddRule::Connect:
        QObjectPrivate::connect(button, &QAbstractButton::clicked,
                               this, &QDialogButtonBoxPrivate::handleButtonClicked);
        QObjectPrivate::connect(button, &QAbstractButton::destroyed,
                               this, &QDialogButtonBoxPrivate::handleButtonDestroyed);
        button->installEventFilter(filter.get());
        break;
    case AddRule::SkipConnect:
        break;
    }

    switch (layoutRule) {
    case LayoutRule::DoLayout:
        layoutButtons();
        break;
    case LayoutRule::SkipLayout:
        break;
    }
}